

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::set_ip_filter(torrent *this,shared_ptr<const_libtorrent::ip_filter> *ipf)

{
  shared_ptr<const_libtorrent::ip_filter> *ipf_local;
  torrent *this_local;
  
  ::std::shared_ptr<const_libtorrent::ip_filter>::operator=(&this->m_ip_filter,ipf);
  if ((*(uint *)&this->field_0x5d8 >> 0x19 & 1) != 0) {
    ip_filter_updated(this);
  }
  return;
}

Assistant:

void torrent::set_ip_filter(std::shared_ptr<const ip_filter> ipf)
	{
		m_ip_filter = std::move(ipf);
		if (!m_apply_ip_filter) return;
		ip_filter_updated();
	}